

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

flexScore negaMax(game *Game,int depth,flexScore alpha,flexScore beta)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  move moveMade;
  long lVar4;
  game *pgVar5;
  game *pgVar6;
  game *pgVar7;
  byte bVar8;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  flexScore beta_00;
  flexScore fVar9;
  flexScore fVar10;
  flexScore score;
  arrayMoveList moves;
  flexScore local_5d0;
  flexScore local_5c0;
  int local_5ac;
  flexScore local_5a8;
  ulong local_598;
  stack<move,_std::deque<move,_std::allocator<move>_>_> *local_590;
  undefined1 local_588 [16];
  game *local_570;
  stack<move,_std::deque<move,_std::allocator<move>_>_> *local_568;
  stack<bitboards,_std::deque<bitboards,_std::allocator<bitboards>_>_> *local_560;
  game local_558;
  game local_448;
  arrayMoveList local_338;
  
  local_5d0._8_8_ = beta._8_8_;
  local_5d0.score = beta.score;
  local_5a8._8_8_ = alpha._8_8_;
  bVar8 = 0;
  local_5a8.score = alpha.score;
  local_5ac = depth;
  if (depth == 0) {
    bVar2 = Game->blacksTurn;
    pgVar6 = Game;
    pgVar5 = &local_448;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pgVar5->boards).WP = (pgVar6->boards).WP;
      pgVar6 = (game *)&(pgVar6->boards).WN;
      pgVar5 = (game *)&(pgVar5->boards).WN;
    }
    std::deque<bitboards,_std::allocator<bitboards>_>::deque
              (&local_448.boardHistory.c,&(Game->boardHistory).c);
    std::deque<move,_std::allocator<move>_>::deque(&local_448.history.c,&(Game->history).c);
    local_448.blacksTurn = Game->blacksTurn;
    dVar1 = positionStrengthFast(&local_448);
    local_588._8_4_ = extraout_XMM0_Dc;
    local_588._0_8_ = dVar1;
    local_588._12_4_ = extraout_XMM0_Dd;
    if (bVar2 != false) {
      local_588._0_8_ = (ulong)dVar1 ^ 0x8000000000000000;
      local_588._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    }
    std::_Deque_base<move,_std::allocator<move>_>::~_Deque_base
              ((_Deque_base<move,_std::allocator<move>_> *)&local_448.history);
    std::_Deque_base<bitboards,_std::allocator<bitboards>_>::~_Deque_base
              ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&local_448.boardHistory);
    local_598 = 0;
  }
  else {
    game::generateLegalMoves(&local_338,Game);
    arrayMoveList::resetIterator(&local_338);
    bVar2 = arrayMoveList::next(&local_338);
    if (bVar2) {
      arrayMoveList::resetIterator(&local_338);
      local_560 = &Game->boardHistory;
      local_590 = &local_558.history;
      local_568 = &Game->history;
      local_5ac = local_5ac + -1;
      local_570 = Game;
      do {
        pgVar6 = local_570;
        bVar2 = arrayMoveList::next(&local_338);
        if (!bVar2) {
          local_588._0_8_ = local_5a8.score;
          local_598 = local_5a8._8_8_;
          break;
        }
        moveMade = arrayMoveList::getMove(&local_338);
        game::makeMove(pgVar6,moveMade);
        pgVar5 = pgVar6;
        pgVar7 = &local_558;
        for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
          (pgVar7->boards).WP = (pgVar5->boards).WP;
          pgVar5 = (game *)((long)pgVar5 + (ulong)bVar8 * -0x10 + 8);
          pgVar7 = (game *)((long)pgVar7 + (ulong)bVar8 * -0x10 + 8);
        }
        std::deque<bitboards,_std::allocator<bitboards>_>::deque
                  (&local_558.boardHistory.c,&local_560->c);
        std::deque<move,_std::allocator<move>_>::deque(&local_590->c,&local_568->c);
        local_558.blacksTurn = pgVar6->blacksTurn;
        fVar9._8_8_ = ((ulong)(local_5d0.count + 1) | local_5d0._8_8_ & 0xff01ffff00000000) ^
                      0x1000000000000;
        beta_00._8_8_ =
             ((ulong)(local_5a8.count + 1) | local_5a8._8_8_ & 0xff01ffff00000000) ^ 0x1000000000000
        ;
        fVar9.score = local_5d0.score;
        beta_00.score = local_5a8.score;
        fVar9 = negaMax(&local_558,local_5ac,fVar9,beta_00);
        local_5c0._8_8_ =
             ((ulong)(fVar9.count - 1) | fVar9._8_8_ & 0xff01ffff00000000) ^ 0x1000000000000;
        local_5c0.score = fVar9.score;
        std::_Deque_base<move,_std::allocator<move>_>::~_Deque_base
                  ((_Deque_base<move,_std::allocator<move>_> *)local_590);
        std::_Deque_base<bitboards,_std::allocator<bitboards>_>::~_Deque_base
                  ((_Deque_base<bitboards,_std::allocator<bitboards>_> *)&local_558.boardHistory);
        game::undoMove(pgVar6);
        bVar3 = flexScore::operator>(&local_5c0,&local_5d0);
        bVar2 = true;
        if (!bVar3) {
          if (local_5c0.extreme == local_5d0.extreme) {
            if (local_5c0.tethered == local_5d0.tethered) {
              if (local_5c0.draw == local_5d0.draw) {
                if (local_5c0.extreme == false) {
                  if (local_5c0.tethered == false) {
                    bVar2 = local_5d0.score == local_5c0.score;
                  }
                  else {
                    bVar2 = local_5c0.count == local_5d0.count;
                    if (local_5c0.draw == false) {
                      bVar2 = local_5c0.favorable == local_5d0.favorable &&
                              local_5c0.count == local_5d0.count;
                    }
                  }
                }
                else {
                  bVar2 = local_5c0.favorable == local_5d0.favorable;
                }
                goto LAB_00102f0d;
              }
            }
          }
          bVar2 = false;
        }
LAB_00102f0d:
        if (bVar2) {
          local_588._8_8_ = 0;
          local_588._0_8_ = local_5d0.score;
          local_598._0_4_ = local_5d0.count;
          local_598._4_1_ = local_5d0.draw;
          local_598._5_1_ = local_5d0.tethered;
          local_598._6_1_ = local_5d0.favorable;
          local_598._7_1_ = local_5d0.extreme;
        }
        else {
          bVar3 = flexScore::operator>(&local_5c0,&local_5a8);
          if (bVar3) {
            local_5a8.score = local_5c0.score;
            local_5a8.count = local_5c0.count;
            local_5a8.draw = local_5c0.draw;
            local_5a8.tethered = local_5c0.tethered;
            local_5a8.favorable = local_5c0.favorable;
            local_5a8.extreme = local_5c0.extreme;
          }
        }
      } while (!bVar2);
    }
    else {
      local_598 = 0x10100000000;
      local_588._0_8_ = 0.0;
    }
  }
  fVar10.count = (int)local_598;
  fVar10.draw = (bool)(char)(local_598 >> 0x20);
  fVar10.tethered = (bool)(char)(local_598 >> 0x28);
  fVar10.favorable = (bool)(char)(local_598 >> 0x30);
  fVar10.extreme = (bool)(char)(local_598 >> 0x38);
  fVar10.score = (double)local_588._0_8_;
  return fVar10;
}

Assistant:

flexScore negaMax(game Game, int depth, flexScore alpha, flexScore beta) {
    if(depth == 0) {
      double side;
      if(Game.blacksTurn) {
        side = -1.0;
      } else {
        side = 1.0;
      }

      flexScore returner;
      returner.score = side*positionStrengthFast(Game);
      return returner;
    }

    arrayMoveList moves = Game.generateLegalMoves();
    moves.resetIterator();
    if(!moves.next()) {
      flexScore returner;
      returner.tethered = true;
      returner.count = 0;
      returner.draw = true; // We currently assume this is a draw
      return returner;
    }
    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      flexScore score = -negaMax(Game, depth - 1, --beta, --alpha);
      Game.undoMove();
      if(score >= beta) {
        return beta;
      }
      if(score > alpha)
        alpha = score;
    }

    return alpha;
}